

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O2

string * __thiscall
afsm::test::connection_fsm_def::transaction::simple_query::name_abi_cxx11_
          (string *__return_storage_ptr__,simple_query *this)

{
  common_base<afsm::test::state_name> *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = transitions::
           state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::simple_query,unsigned_long>
           ::cast_current_state<afsm::def::tags::common_base<afsm::test::state_name>const>
                     ((state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::simple_query,unsigned_long>
                       *)(this + 1));
  (*(pcVar1->super_state_name)._vptr_state_name[2])(&local_30,pcVar1);
  std::operator+(__return_storage_ptr__,"simple query ",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

::std::string
            name() const override
            {
                return "simple query " + fsm().current_state_base().name();
            }